

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

Operand * translateRegister(Operand *__return_storage_ptr__,Operand *reg)

{
  pointer pcVar1;
  int iVar2;
  Operand *extraout_RAX;
  string *psVar3;
  size_type *psVar4;
  
  switch(reg->reg_num) {
  case 0x10:
    iVar2 = registers.a.reg_num;
    __return_storage_ptr__->type = registers.a.type;
    __return_storage_ptr__->reg_num = iVar2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar3 = &registers.a.value;
    psVar4 = &registers.a.value._M_string_length;
    break;
  case 0x11:
    iVar2 = registers.b.reg_num;
    __return_storage_ptr__->type = registers.b.type;
    __return_storage_ptr__->reg_num = iVar2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar3 = &registers.b.value;
    psVar4 = &registers.b.value._M_string_length;
    break;
  default:
    iVar2 = reg->reg_num;
    __return_storage_ptr__->type = reg->type;
    __return_storage_ptr__->reg_num = iVar2;
    psVar3 = &reg->value;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar4 = &(reg->value)._M_string_length;
    break;
  case 0x14:
    iVar2 = registers.bc.reg_num;
    __return_storage_ptr__->type = registers.bc.type;
    __return_storage_ptr__->reg_num = iVar2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar3 = &registers.bc.value;
    psVar4 = &registers.bc.value._M_string_length;
    break;
  case 0x15:
    iVar2 = registers.de.reg_num;
    __return_storage_ptr__->type = registers.de.type;
    __return_storage_ptr__->reg_num = iVar2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar3 = &registers.de.value;
    psVar4 = &registers.de.value._M_string_length;
    break;
  case 0x16:
    iVar2 = registers.sp.reg_num;
    __return_storage_ptr__->type = registers.sp.type;
    __return_storage_ptr__->reg_num = iVar2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar3 = &registers.sp.value;
    psVar4 = &registers.sp.value._M_string_length;
    break;
  case 0x17:
    iVar2 = registers.iy.reg_num;
    __return_storage_ptr__->type = registers.iy.type;
    __return_storage_ptr__->reg_num = iVar2;
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    psVar3 = &registers.iy.value;
    psVar4 = &registers.iy.value._M_string_length;
  }
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->value,pcVar1,pcVar1 + *psVar4);
  return extraout_RAX;
}

Assistant:

static Operand translateRegister(const Operand reg) {
	switch (reg.reg_num) {
		case 0x10:
			return registers.a;
		case 0x11:
			return registers.b;
		case 0x14:
			return registers.bc;
		case 0x15:
			return registers.de;
		case 0x16:
			return registers.sp;
		case 0x17:
			return registers.iy;
	}
	return reg;
}